

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          int num_digits,string_view prefix,basic_format_specs<wchar_t> *spec,bin_writer<1> f)

{
  alignment aVar1;
  uint uVar2;
  assertion_failure *this_00;
  ulong uVar3;
  ulong uVar4;
  align_spec local_58;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<1>_>
  local_48;
  
  local_48.prefix.size_ = prefix.size_;
  local_48.prefix.data_ = prefix.data_;
  if (num_digits < 0) {
    this_00 = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this_00,"negative value");
    goto LAB_0011c4b3;
  }
  uVar3 = (uint)num_digits + local_48.prefix.size_;
  local_48.fill = (spec->super_align_spec).fill_;
  aVar1 = (spec->super_align_spec).align_;
  if (aVar1 == ALIGN_NUMERIC) {
    uVar4 = (ulong)(spec->super_align_spec).width_;
    local_48.size_ = uVar4;
    if (uVar4 < uVar3) {
      local_48.size_ = uVar3;
    }
    local_48.padding = 0;
    if (uVar3 <= uVar4) {
      local_48.padding = uVar4 - uVar3;
    }
  }
  else {
    uVar2 = (spec->super_core_format_specs).precision;
    if (num_digits < (int)uVar2) {
      if ((int)uVar2 < 0) {
        this_00 = (assertion_failure *)__cxa_allocate_exception(0x10);
        assertion_failure::assertion_failure(this_00,"negative value");
      }
      else {
        if (-1 < (int)(uVar2 - num_digits)) {
          local_48.fill = L'0';
          local_48.padding = (ulong)(uVar2 - num_digits);
          local_48.size_ = uVar2 + local_48.prefix.size_;
          goto LAB_0011c444;
        }
        this_00 = (assertion_failure *)__cxa_allocate_exception(0x10);
        assertion_failure::assertion_failure(this_00,"negative value");
      }
LAB_0011c4b3:
      __cxa_throw(this_00,&assertion_failure::typeinfo,std::logic_error::~logic_error);
    }
    local_48.padding = 0;
    local_48.size_ = uVar3;
  }
LAB_0011c444:
  local_58.align_ = (spec->super_align_spec).align_;
  local_58.width_ = (spec->super_align_spec).width_;
  local_58.fill_ = (spec->super_align_spec).fill_;
  if (aVar1 == ALIGN_DEFAULT) {
    local_58.align_ = ALIGN_RIGHT;
  }
  local_48.f.abs_value = f.abs_value;
  local_48.f.num_digits = f.num_digits;
  local_48.f._12_4_ = f._12_4_;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>>
            (this,&local_58,&local_48);
  return;
}

Assistant:

inline uint32_t clzll(uint64_t x) {
  unsigned long r = 0;
# ifdef _WIN64
  _BitScanReverse64(&r, x);
# else
  // Scan the high 32 bits.
  if (_BitScanReverse(&r, static_cast<uint32_t>(x >> 32)))
    return 63 - (r + 32);

  // Scan the low 32 bits.
  _BitScanReverse(&r, static_cast<uint32_t>(x));
# endif

  assert(x != 0);
  // Static analysis complains about using uninitialized data
  // "r", but the only way that can happen is if "x" is 0,
  // which the callers guarantee to not happen.
# pragma warning(suppress: 6102)
  return 63 - r;
}